

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O2

void __thiscall mognetwork::TcpSocket::~TcpSocket(TcpSocket *this)

{
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__TcpSocket_00114c98;
  if (this->m_protocolListener != (AProtocolListener *)0x0) {
    (*this->m_protocolListener->_vptr_AProtocolListener[1])();
  }
  Mutex::~Mutex(&this->m_mutex);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_pendingRDatas).datas.super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::
  _List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
  ::_M_clear(&(this->m_pendingDatas).
              super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
            );
  Socket::~Socket(&this->super_Socket);
  return;
}

Assistant:

TcpSocket::~TcpSocket()
  {
    if (m_protocolListener != NULL)
      delete m_protocolListener;
  }